

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_vertex.cxx
# Opt level: O1

void __thiscall Fl_Graphics_Driver::end_complex_polygon(Fl_Graphics_Driver *this)

{
  (*(this->super_Fl_Device)._vptr_Fl_Device[0x27])();
  if (this->n < 3) {
    (*(this->super_Fl_Device)._vptr_Fl_Device[0x23])(this);
    return;
  }
  XFillPolygon(fl_display,fl_window,fl_gc,this->p,this->n,0,0);
  return;
}

Assistant:

void Fl_Graphics_Driver::end_complex_polygon() {
  gap();
  if (n < 3) {
    end_line();
    return;
  }
#if defined(USE_X11)
  if (n>2) XFillPolygon(fl_display, fl_window, fl_gc, p, n, 0, 0);
#elif defined(WIN32)
  if (n>2) {
    SelectObject(fl_gc, fl_brush());
    PolyPolygon(fl_gc, p, counts, numcount);
  }
#elif defined(__APPLE_QUARTZ__)
  if (n<=1) return;
  CGContextSetShouldAntialias(fl_gc, true);
  CGContextMoveToPoint(fl_gc, p[0].x, p[0].y);
  for (int i=1; i<n; i++)
    CGContextAddLineToPoint(fl_gc, p[i].x, p[i].y);
  CGContextClosePath(fl_gc);
  CGContextFillPath(fl_gc);
  CGContextSetShouldAntialias(fl_gc, false);
#else
# error unsupported platform
#endif
}